

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_var_2d_u8_sse2(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  int32_t iVar39;
  int in_ECX;
  int in_EDX;
  longlong in_RSI;
  longlong in_RDI;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i vec_a;
  __m128i vec_a_00;
  __m128i vec_a_01;
  __m128i vec_a_02;
  uint8_t val;
  int m;
  int k_2;
  __m128i vsqs1_1;
  __m128i vsqs0_1;
  __m128i vsrc1_1;
  __m128i vsrc0_1;
  __m128i vsrc_1;
  __m128i vsqs1;
  __m128i vsqs0;
  __m128i vsrc1;
  __m128i vsrc0;
  int k_1;
  int k;
  __m128i vsrc [8];
  int j;
  int i;
  __m128i v_acc_sqs;
  __m128i v_acc_sum;
  __m128i vzero;
  uint64_t ss;
  uint64_t s;
  uint8_t *srcp;
  int local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  int local_320;
  int local_31c;
  undefined8 local_318 [17];
  int local_290;
  int local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  long local_258;
  long local_250;
  undefined8 *local_248;
  int local_23c;
  int local_238;
  int local_234;
  long local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_234 = (int)in_RSI;
  local_250 = 0;
  local_258 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_23c = in_ECX;
  local_238 = in_EDX;
  local_230 = in_RDI;
  for (local_28c = 0; local_28c < local_238 + -0xf; local_28c = local_28c + 0x10) {
    local_248 = (undefined8 *)(local_230 + local_28c);
    local_290 = 0;
    while( true ) {
      uVar9 = uStack_40;
      uVar8 = local_88;
      local_88._0_1_ = (undefined1)local_268;
      uVar23 = (undefined1)local_88;
      local_88._1_1_ = (undefined1)((ulong)local_268 >> 8);
      uVar24 = local_88._1_1_;
      local_88._2_1_ = (undefined1)((ulong)local_268 >> 0x10);
      uVar25 = local_88._2_1_;
      local_88._3_1_ = (undefined1)((ulong)local_268 >> 0x18);
      uVar26 = local_88._3_1_;
      local_88._4_1_ = (undefined1)((ulong)local_268 >> 0x20);
      uVar27 = local_88._4_1_;
      local_88._5_1_ = (undefined1)((ulong)local_268 >> 0x28);
      uVar28 = local_88._5_1_;
      local_88._6_1_ = (undefined1)((ulong)local_268 >> 0x30);
      uVar29 = local_88._6_1_;
      local_88._7_1_ = (undefined1)((ulong)local_268 >> 0x38);
      uVar30 = local_88._7_1_;
      uStack_40._0_1_ = (undefined1)uStack_260;
      uVar31 = (undefined1)uStack_40;
      uStack_40._1_1_ = (undefined1)((ulong)uStack_260 >> 8);
      uVar32 = uStack_40._1_1_;
      uStack_40._2_1_ = (undefined1)((ulong)uStack_260 >> 0x10);
      uVar33 = uStack_40._2_1_;
      uStack_40._3_1_ = (undefined1)((ulong)uStack_260 >> 0x18);
      uVar34 = uStack_40._3_1_;
      uStack_40._4_1_ = (undefined1)((ulong)uStack_260 >> 0x20);
      uVar35 = uStack_40._4_1_;
      uStack_40._5_1_ = (undefined1)((ulong)uStack_260 >> 0x28);
      uVar36 = uStack_40._5_1_;
      uStack_40._6_1_ = (undefined1)((ulong)uStack_260 >> 0x30);
      uVar37 = uStack_40._6_1_;
      uStack_40._7_1_ = (undefined1)((ulong)uStack_260 >> 0x38);
      uVar38 = uStack_40._7_1_;
      local_288 = local_268;
      uStack_280 = uStack_260;
      local_278 = local_268;
      uStack_270 = uStack_260;
      if (local_23c + -7 <= local_290) break;
      for (local_31c = 0; local_31c < 8; local_31c = local_31c + 1) {
        local_90 = local_248;
        uVar2 = local_248[1];
        local_318[(long)local_31c * 2] = *local_248;
        local_318[(long)local_31c * 2 + 1] = uVar2;
        local_248 = (undefined8 *)((long)local_248 + (long)local_234);
      }
      for (local_320 = 0; local_320 < 8; local_320 = local_320 + 1) {
        uVar2 = local_318[(long)local_320 * 2];
        uStack_50 = local_318[(long)local_320 * 2 + 1];
        local_68 = local_268;
        uStack_60 = uStack_260;
        local_58._0_1_ = (undefined1)uVar2;
        local_58._1_1_ = (undefined1)((ulong)uVar2 >> 8);
        local_58._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
        local_58._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
        local_58._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
        local_58._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
        local_58._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
        local_58._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
        local_18 = local_318[(long)local_320 * 2];
        uVar3 = local_318[(long)local_320 * 2 + 1];
        local_28 = local_268;
        uStack_20 = uStack_260;
        uStack_10._0_1_ = (undefined1)uVar3;
        uStack_10._1_1_ = (undefined1)((ulong)uVar3 >> 8);
        uStack_10._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_10._3_1_ = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_10._4_1_ = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_10._5_1_ = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_10._6_1_ = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_10._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
        uVar4 = local_278;
        uVar5 = uStack_270;
        uVar10 = CONCAT13(local_88._1_1_,
                          CONCAT12(local_58._1_1_,
                                   CONCAT11((undefined1)local_88,(undefined1)local_58)));
        uVar11 = CONCAT15(local_88._2_1_,CONCAT14(local_58._2_1_,uVar10));
        uVar16 = CONCAT17(local_88._3_1_,CONCAT16(local_58._3_1_,uVar11));
        uVar12 = CONCAT13(local_88._5_1_,
                          CONCAT12(local_58._5_1_,CONCAT11(local_88._4_1_,local_58._4_1_)));
        uVar13 = CONCAT15(local_88._6_1_,CONCAT14(local_58._6_1_,uVar12));
        uVar17 = CONCAT17(local_88._7_1_,CONCAT16(local_58._7_1_,uVar13));
        local_138._0_2_ = (short)local_278;
        local_138._2_2_ = (short)((ulong)local_278 >> 0x10);
        local_138._4_2_ = (short)((ulong)local_278 >> 0x20);
        local_138._6_2_ = (short)((ulong)local_278 >> 0x30);
        uStack_130._0_2_ = (short)uStack_270;
        uStack_130._2_2_ = (short)((ulong)uStack_270 >> 0x10);
        uStack_130._4_2_ = (short)((ulong)uStack_270 >> 0x20);
        uStack_130._6_2_ = (short)((ulong)uStack_270 >> 0x30);
        local_148._2_2_ = (short)((uint)uVar10 >> 0x10);
        local_148._4_2_ = (short)((uint6)uVar11 >> 0x20);
        local_148._6_2_ = (short)((ulong)uVar16 >> 0x30);
        uStack_140._2_2_ = (short)((uint)uVar12 >> 0x10);
        uStack_140._4_2_ = (short)((uint6)uVar13 >> 0x20);
        uStack_140._6_2_ = (short)((ulong)uVar17 >> 0x30);
        local_138._0_2_ = (short)local_138 + CONCAT11((undefined1)local_88,(undefined1)local_58);
        uStack_130._0_2_ = (short)uStack_130 + CONCAT11(local_88._4_1_,local_58._4_1_);
        local_278._0_4_ = CONCAT22(local_138._2_2_ + local_148._2_2_,(short)local_138);
        local_278._0_6_ = CONCAT24(local_138._4_2_ + local_148._4_2_,(undefined4)local_278);
        local_278 = CONCAT26(local_138._6_2_ + local_148._6_2_,(undefined6)local_278);
        uStack_270._0_4_ = CONCAT22(uStack_130._2_2_ + uStack_140._2_2_,(short)uStack_130);
        uStack_270._0_6_ = CONCAT24(uStack_130._4_2_ + uStack_140._4_2_,(undefined4)uStack_270);
        uStack_270 = CONCAT26(uStack_130._6_2_ + uStack_140._6_2_,(undefined6)uStack_270);
        local_158 = local_278;
        uStack_150 = uStack_270;
        uVar10 = CONCAT13(uStack_40._1_1_,
                          CONCAT12(uStack_10._1_1_,
                                   CONCAT11((undefined1)uStack_40,(undefined1)uStack_10)));
        uVar11 = CONCAT15(uStack_40._2_1_,CONCAT14(uStack_10._2_1_,uVar10));
        uVar14 = CONCAT17(uStack_40._3_1_,CONCAT16(uStack_10._3_1_,uVar11));
        uVar12 = CONCAT13(uStack_40._5_1_,
                          CONCAT12(uStack_10._5_1_,CONCAT11(uStack_40._4_1_,uStack_10._4_1_)));
        uVar13 = CONCAT15(uStack_40._6_1_,CONCAT14(uStack_10._6_1_,uVar12));
        uVar15 = CONCAT17(uStack_40._7_1_,CONCAT16(uStack_10._7_1_,uVar13));
        local_168._2_2_ = (short)((uint)uVar10 >> 0x10);
        local_168._4_2_ = (short)((uint6)uVar11 >> 0x20);
        local_168._6_2_ = (short)((ulong)uVar14 >> 0x30);
        uStack_160._2_2_ = (short)((uint)uVar12 >> 0x10);
        uStack_160._4_2_ = (short)((uint6)uVar13 >> 0x20);
        uStack_160._6_2_ = (short)((ulong)uVar15 >> 0x30);
        local_278._0_4_ =
             CONCAT22(local_138._2_2_ + local_148._2_2_ + local_168._2_2_,
                      (short)local_138 + CONCAT11((undefined1)uStack_40,(undefined1)uStack_10));
        local_278._0_6_ =
             CONCAT24(local_138._4_2_ + local_148._4_2_ + local_168._4_2_,(undefined4)local_278);
        local_278 = CONCAT26(local_138._6_2_ + local_148._6_2_ + local_168._6_2_,
                             (undefined6)local_278);
        uStack_270._0_4_ =
             CONCAT22(uStack_130._2_2_ + uStack_140._2_2_ + uStack_160._2_2_,
                      (short)uStack_130 + CONCAT11(uStack_40._4_1_,uStack_10._4_1_));
        uStack_270._0_6_ =
             CONCAT24(uStack_130._4_2_ + uStack_140._4_2_ + uStack_160._4_2_,(undefined4)uStack_270)
        ;
        uStack_270 = CONCAT26(uStack_130._6_2_ + uStack_140._6_2_ + uStack_160._6_2_,
                              (undefined6)uStack_270);
        local_b8 = CONCAT17(local_88._3_1_,
                            CONCAT16(local_58._3_1_,
                                     CONCAT15(local_88._2_1_,
                                              CONCAT14(local_58._2_1_,
                                                       CONCAT13(local_88._1_1_,
                                                                CONCAT12(local_58._1_1_,
                                                                         CONCAT11((undefined1)
                                                                                  local_88,(
                                                  undefined1)local_58)))))));
        uStack_b0 = CONCAT17(local_88._7_1_,
                             CONCAT16(local_58._7_1_,
                                      CONCAT15(local_88._6_1_,
                                               CONCAT14(local_58._6_1_,
                                                        CONCAT13(local_88._5_1_,
                                                                 CONCAT12(local_58._5_1_,
                                                                          CONCAT11(local_88._4_1_,
                                                                                   local_58._4_1_)))
                                                       ))));
        local_c8 = CONCAT17(local_88._3_1_,
                            CONCAT16(local_58._3_1_,
                                     CONCAT15(local_88._2_1_,
                                              CONCAT14(local_58._2_1_,
                                                       CONCAT13(local_88._1_1_,
                                                                CONCAT12(local_58._1_1_,
                                                                         CONCAT11((undefined1)
                                                                                  local_88,(
                                                  undefined1)local_58)))))));
        uStack_c0 = CONCAT17(local_88._7_1_,
                             CONCAT16(local_58._7_1_,
                                      CONCAT15(local_88._6_1_,
                                               CONCAT14(local_58._6_1_,
                                                        CONCAT13(local_88._5_1_,
                                                                 CONCAT12(local_58._5_1_,
                                                                          CONCAT11(local_88._4_1_,
                                                                                   local_58._4_1_)))
                                                       ))));
        auVar22._8_8_ = uStack_b0;
        auVar22._0_8_ = local_b8;
        auVar40._8_8_ = uStack_c0;
        auVar40._0_8_ = local_c8;
        auVar40 = pmaddwd(auVar22,auVar40);
        local_d8 = CONCAT17(uStack_40._3_1_,
                            CONCAT16(uStack_10._3_1_,
                                     CONCAT15(uStack_40._2_1_,
                                              CONCAT14(uStack_10._2_1_,
                                                       CONCAT13(uStack_40._1_1_,
                                                                CONCAT12(uStack_10._1_1_,
                                                                         CONCAT11((undefined1)
                                                                                  uStack_40,
                                                                                  (undefined1)
                                                                                  uStack_10)))))));
        uStack_d0 = CONCAT17(uStack_40._7_1_,
                             CONCAT16(uStack_10._7_1_,
                                      CONCAT15(uStack_40._6_1_,
                                               CONCAT14(uStack_10._6_1_,
                                                        CONCAT13(uStack_40._5_1_,
                                                                 CONCAT12(uStack_10._5_1_,
                                                                          CONCAT11(uStack_40._4_1_,
                                                                                   uStack_10._4_1_))
                                                                )))));
        local_e8 = CONCAT17(uStack_40._3_1_,
                            CONCAT16(uStack_10._3_1_,
                                     CONCAT15(uStack_40._2_1_,
                                              CONCAT14(uStack_10._2_1_,
                                                       CONCAT13(uStack_40._1_1_,
                                                                CONCAT12(uStack_10._1_1_,
                                                                         CONCAT11((undefined1)
                                                                                  uStack_40,
                                                                                  (undefined1)
                                                                                  uStack_10)))))));
        uStack_e0 = CONCAT17(uStack_40._7_1_,
                             CONCAT16(uStack_10._7_1_,
                                      CONCAT15(uStack_40._6_1_,
                                               CONCAT14(uStack_10._6_1_,
                                                        CONCAT13(uStack_40._5_1_,
                                                                 CONCAT12(uStack_10._5_1_,
                                                                          CONCAT11(uStack_40._4_1_,
                                                                                   uStack_10._4_1_))
                                                                )))));
        auVar42._8_8_ = uStack_d0;
        auVar42._0_8_ = local_d8;
        auVar41._8_8_ = uStack_e0;
        auVar41._0_8_ = local_e8;
        auVar41 = pmaddwd(auVar42,auVar41);
        uVar6 = local_288;
        uVar7 = uStack_280;
        local_358 = auVar40._0_8_;
        uStack_350 = auVar40._8_8_;
        local_1b8._0_4_ = (int)local_288;
        local_1b8._4_4_ = (int)((ulong)local_288 >> 0x20);
        uStack_1b0._0_4_ = (int)uStack_280;
        uStack_1b0._4_4_ = (int)((ulong)uStack_280 >> 0x20);
        local_1c8._0_4_ = auVar40._0_4_;
        local_1c8._4_4_ = auVar40._4_4_;
        uStack_1c0._0_4_ = auVar40._8_4_;
        uStack_1c0._4_4_ = auVar40._12_4_;
        local_288 = CONCAT44(local_1b8._4_4_ + local_1c8._4_4_,(int)local_1b8 + (int)local_1c8);
        uStack_280 = CONCAT44(uStack_1b0._4_4_ + uStack_1c0._4_4_,(int)uStack_1b0 + (int)uStack_1c0)
        ;
        local_1d8 = local_288;
        uStack_1d0 = uStack_280;
        local_368 = auVar41._0_8_;
        uStack_360 = auVar41._8_8_;
        local_1e8._0_4_ = auVar41._0_4_;
        local_1e8._4_4_ = auVar41._4_4_;
        uStack_1e0._0_4_ = auVar41._8_4_;
        uStack_1e0._4_4_ = auVar41._12_4_;
        local_288 = CONCAT44(local_1b8._4_4_ + local_1c8._4_4_ + local_1e8._4_4_,
                             (int)local_1b8 + (int)local_1c8 + (int)local_1e8);
        uStack_280 = CONCAT44(uStack_1b0._4_4_ + uStack_1c0._4_4_ + uStack_1e0._4_4_,
                              (int)uStack_1b0 + (int)uStack_1c0 + (int)uStack_1e0);
        local_1e8 = local_368;
        uStack_1e0 = uStack_360;
        local_1c8 = local_358;
        uStack_1c0 = uStack_350;
        local_1b8 = uVar6;
        uStack_1b0 = uVar7;
        local_168 = uVar14;
        uStack_160 = uVar15;
        local_148 = uVar16;
        uStack_140 = uVar17;
        local_138 = uVar4;
        uStack_130 = uVar5;
        local_58 = uVar2;
        uStack_10 = uVar3;
      }
      vec_a[1] = in_RSI;
      vec_a[0] = in_RDI;
      local_88 = uVar8;
      uStack_40 = uVar9;
      iVar39 = mm_accumulate_epi16(vec_a);
      local_250 = iVar39 + local_250;
      vec_a_00[1] = in_RSI;
      vec_a_00[0] = in_RDI;
      iVar39 = mm_accumulate_epi32(vec_a_00);
      local_258 = iVar39 + local_258;
      local_290 = local_290 + 8;
    }
    for (; uStack_40 = uVar9, local_88 = uVar8, local_290 < local_23c; local_290 = local_290 + 1) {
      local_98 = local_248;
      local_38 = *local_248;
      uStack_70 = local_248[1];
      uStack_80 = uStack_260;
      local_78._0_1_ = (undefined1)local_38;
      local_78._1_1_ = (undefined1)((ulong)local_38 >> 8);
      local_78._2_1_ = (undefined1)((ulong)local_38 >> 0x10);
      local_78._3_1_ = (undefined1)((ulong)local_38 >> 0x18);
      local_78._4_1_ = (undefined1)((ulong)local_38 >> 0x20);
      local_78._5_1_ = (undefined1)((ulong)local_38 >> 0x28);
      local_78._6_1_ = (undefined1)((ulong)local_38 >> 0x30);
      local_78._7_1_ = (undefined1)((ulong)local_38 >> 0x38);
      local_48 = local_268;
      uStack_30._0_1_ = (undefined1)uStack_70;
      uStack_30._1_1_ = (undefined1)((ulong)uStack_70 >> 8);
      uStack_30._2_1_ = (undefined1)((ulong)uStack_70 >> 0x10);
      uStack_30._3_1_ = (undefined1)((ulong)uStack_70 >> 0x18);
      uStack_30._4_1_ = (undefined1)((ulong)uStack_70 >> 0x20);
      uStack_30._5_1_ = (undefined1)((ulong)uStack_70 >> 0x28);
      uStack_30._6_1_ = (undefined1)((ulong)uStack_70 >> 0x30);
      uStack_30._7_1_ = (undefined1)((ulong)uStack_70 >> 0x38);
      uVar8 = local_278;
      uVar9 = uStack_270;
      uVar10 = CONCAT13(uVar24,CONCAT12(local_78._1_1_,CONCAT11(uVar23,(undefined1)local_78)));
      uVar11 = CONCAT15(uVar25,CONCAT14(local_78._2_1_,uVar10));
      uVar6 = CONCAT17(uVar26,CONCAT16(local_78._3_1_,uVar11));
      uVar12 = CONCAT13(uVar28,CONCAT12(local_78._5_1_,CONCAT11(uVar27,local_78._4_1_)));
      uVar13 = CONCAT15(uVar29,CONCAT14(local_78._6_1_,uVar12));
      uVar7 = CONCAT17(uVar30,CONCAT16(local_78._7_1_,uVar13));
      local_178._0_2_ = (short)local_278;
      local_178._2_2_ = (short)((ulong)local_278 >> 0x10);
      local_178._4_2_ = (short)((ulong)local_278 >> 0x20);
      local_178._6_2_ = (short)((ulong)local_278 >> 0x30);
      uStack_170._0_2_ = (short)uStack_270;
      uStack_170._2_2_ = (short)((ulong)uStack_270 >> 0x10);
      uStack_170._4_2_ = (short)((ulong)uStack_270 >> 0x20);
      uStack_170._6_2_ = (short)((ulong)uStack_270 >> 0x30);
      local_188._2_2_ = (short)((uint)uVar10 >> 0x10);
      local_188._4_2_ = (short)((uint6)uVar11 >> 0x20);
      local_188._6_2_ = (short)((ulong)uVar6 >> 0x30);
      uStack_180._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_180._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_180._6_2_ = (short)((ulong)uVar7 >> 0x30);
      local_178._0_2_ = (short)local_178 + CONCAT11(uVar23,(undefined1)local_78);
      uStack_170._0_2_ = (short)uStack_170 + CONCAT11(uVar27,local_78._4_1_);
      local_278._0_4_ = CONCAT22(local_178._2_2_ + local_188._2_2_,(short)local_178);
      local_278._0_6_ = CONCAT24(local_178._4_2_ + local_188._4_2_,(undefined4)local_278);
      local_278 = CONCAT26(local_178._6_2_ + local_188._6_2_,(undefined6)local_278);
      uStack_270._0_4_ = CONCAT22(uStack_170._2_2_ + uStack_180._2_2_,(short)uStack_170);
      uStack_270._0_6_ = CONCAT24(uStack_170._4_2_ + uStack_180._4_2_,(undefined4)uStack_270);
      uStack_270 = CONCAT26(uStack_170._6_2_ + uStack_180._6_2_,(undefined6)uStack_270);
      local_198 = local_278;
      uStack_190 = uStack_270;
      uVar10 = CONCAT13(uVar32,CONCAT12(uStack_30._1_1_,CONCAT11(uVar31,(undefined1)uStack_30)));
      uVar11 = CONCAT15(uVar33,CONCAT14(uStack_30._2_1_,uVar10));
      uVar4 = CONCAT17(uVar34,CONCAT16(uStack_30._3_1_,uVar11));
      uVar12 = CONCAT13(uVar36,CONCAT12(uStack_30._5_1_,CONCAT11(uVar35,uStack_30._4_1_)));
      uVar13 = CONCAT15(uVar37,CONCAT14(uStack_30._6_1_,uVar12));
      uVar5 = CONCAT17(uVar38,CONCAT16(uStack_30._7_1_,uVar13));
      local_1a8._2_2_ = (short)((uint)uVar10 >> 0x10);
      local_1a8._4_2_ = (short)((uint6)uVar11 >> 0x20);
      local_1a8._6_2_ = (short)((ulong)uVar4 >> 0x30);
      uStack_1a0._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_1a0._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_1a0._6_2_ = (short)((ulong)uVar5 >> 0x30);
      local_278._0_4_ =
           CONCAT22(local_178._2_2_ + local_188._2_2_ + local_1a8._2_2_,
                    (short)local_178 + CONCAT11(uVar31,(undefined1)uStack_30));
      local_278._0_6_ =
           CONCAT24(local_178._4_2_ + local_188._4_2_ + local_1a8._4_2_,(undefined4)local_278);
      local_278 = CONCAT26(local_178._6_2_ + local_188._6_2_ + local_1a8._6_2_,(undefined6)local_278
                          );
      uStack_270._0_4_ =
           CONCAT22(uStack_170._2_2_ + uStack_180._2_2_ + uStack_1a0._2_2_,
                    (short)uStack_170 + CONCAT11(uVar35,uStack_30._4_1_));
      uStack_270._0_6_ =
           CONCAT24(uStack_170._4_2_ + uStack_180._4_2_ + uStack_1a0._4_2_,(undefined4)uStack_270);
      uStack_270 = CONCAT26(uStack_170._6_2_ + uStack_180._6_2_ + uStack_1a0._6_2_,
                            (undefined6)uStack_270);
      local_f8 = CONCAT17(uVar26,CONCAT16(local_78._3_1_,
                                          CONCAT15(uVar25,CONCAT14(local_78._2_1_,
                                                                   CONCAT13(uVar24,CONCAT12(local_78
                                                  ._1_1_,CONCAT11(uVar23,(undefined1)local_78)))))))
      ;
      uStack_f0 = CONCAT17(uVar30,CONCAT16(local_78._7_1_,
                                           CONCAT15(uVar29,CONCAT14(local_78._6_1_,
                                                                    CONCAT13(uVar28,CONCAT12(
                                                  local_78._5_1_,CONCAT11(uVar27,local_78._4_1_)))))
                                          ));
      local_108 = CONCAT17(uVar26,CONCAT16(local_78._3_1_,
                                           CONCAT15(uVar25,CONCAT14(local_78._2_1_,
                                                                    CONCAT13(uVar24,CONCAT12(
                                                  local_78._1_1_,
                                                  CONCAT11(uVar23,(undefined1)local_78)))))));
      uStack_100 = CONCAT17(uVar30,CONCAT16(local_78._7_1_,
                                            CONCAT15(uVar29,CONCAT14(local_78._6_1_,
                                                                     CONCAT13(uVar28,CONCAT12(
                                                  local_78._5_1_,CONCAT11(uVar27,local_78._4_1_)))))
                                           ));
      auVar21._8_8_ = uStack_f0;
      auVar21._0_8_ = local_f8;
      auVar20._8_8_ = uStack_100;
      auVar20._0_8_ = local_108;
      auVar41 = pmaddwd(auVar21,auVar20);
      local_118 = CONCAT17(uVar34,CONCAT16(uStack_30._3_1_,
                                           CONCAT15(uVar33,CONCAT14(uStack_30._2_1_,
                                                                    CONCAT13(uVar32,CONCAT12(
                                                  uStack_30._1_1_,
                                                  CONCAT11(uVar31,(undefined1)uStack_30)))))));
      uStack_110 = CONCAT17(uVar38,CONCAT16(uStack_30._7_1_,
                                            CONCAT15(uVar37,CONCAT14(uStack_30._6_1_,
                                                                     CONCAT13(uVar36,CONCAT12(
                                                  uStack_30._5_1_,CONCAT11(uVar35,uStack_30._4_1_)))
                                                  ))));
      local_128 = CONCAT17(uVar34,CONCAT16(uStack_30._3_1_,
                                           CONCAT15(uVar33,CONCAT14(uStack_30._2_1_,
                                                                    CONCAT13(uVar32,CONCAT12(
                                                  uStack_30._1_1_,
                                                  CONCAT11(uVar31,(undefined1)uStack_30)))))));
      uStack_120 = CONCAT17(uVar38,CONCAT16(uStack_30._7_1_,
                                            CONCAT15(uVar37,CONCAT14(uStack_30._6_1_,
                                                                     CONCAT13(uVar36,CONCAT12(
                                                  uStack_30._5_1_,CONCAT11(uVar35,uStack_30._4_1_)))
                                                  ))));
      auVar19._8_8_ = uStack_110;
      auVar19._0_8_ = local_118;
      auVar18._8_8_ = uStack_120;
      auVar18._0_8_ = local_128;
      auVar42 = pmaddwd(auVar19,auVar18);
      uVar2 = local_288;
      uVar3 = uStack_280;
      local_3a8 = auVar41._0_8_;
      uStack_3a0 = auVar41._8_8_;
      local_1f8._0_4_ = (int)local_288;
      local_1f8._4_4_ = (int)((ulong)local_288 >> 0x20);
      uStack_1f0._0_4_ = (int)uStack_280;
      uStack_1f0._4_4_ = (int)((ulong)uStack_280 >> 0x20);
      local_208._0_4_ = auVar41._0_4_;
      local_208._4_4_ = auVar41._4_4_;
      uStack_200._0_4_ = auVar41._8_4_;
      uStack_200._4_4_ = auVar41._12_4_;
      local_288 = CONCAT44(local_1f8._4_4_ + local_208._4_4_,(int)local_1f8 + (int)local_208);
      uStack_280 = CONCAT44(uStack_1f0._4_4_ + uStack_200._4_4_,(int)uStack_1f0 + (int)uStack_200);
      local_218 = local_288;
      uStack_210 = uStack_280;
      local_3b8 = auVar42._0_8_;
      uStack_3b0 = auVar42._8_8_;
      local_228._0_4_ = auVar42._0_4_;
      local_228._4_4_ = auVar42._4_4_;
      uStack_220._0_4_ = auVar42._8_4_;
      uStack_220._4_4_ = auVar42._12_4_;
      local_288 = CONCAT44(local_1f8._4_4_ + local_208._4_4_ + local_228._4_4_,
                           (int)local_1f8 + (int)local_208 + (int)local_228);
      uStack_280 = CONCAT44(uStack_1f0._4_4_ + uStack_200._4_4_ + uStack_220._4_4_,
                            (int)uStack_1f0 + (int)uStack_200 + (int)uStack_220);
      local_248 = (undefined8 *)((long)local_248 + (long)local_234);
      local_228 = local_3b8;
      uStack_220 = uStack_3b0;
      local_208 = local_3a8;
      uStack_200 = uStack_3a0;
      local_1f8 = uVar2;
      uStack_1f0 = uVar3;
      local_1a8 = uVar4;
      uStack_1a0 = uVar5;
      local_188 = uVar6;
      uStack_180 = uVar7;
      local_178 = uVar8;
      uStack_170 = uVar9;
      uVar8 = local_268;
      local_78 = local_38;
      uVar9 = uStack_260;
      uStack_30 = uStack_70;
    }
    vec_a_01[1] = in_RSI;
    vec_a_01[0] = in_RDI;
    iVar39 = mm_accumulate_epi16(vec_a_01);
    local_250 = iVar39 + local_250;
    vec_a_02[1] = in_RSI;
    vec_a_02[0] = in_RDI;
    iVar39 = mm_accumulate_epi32(vec_a_02);
    local_258 = iVar39 + local_258;
  }
  local_248 = (undefined8 *)local_230;
  for (local_3bc = 0; local_3bc < local_23c; local_3bc = local_3bc + 1) {
    for (local_3c0 = local_28c; local_3c0 < local_238; local_3c0 = local_3c0 + 1) {
      bVar1 = *(byte *)((long)local_248 + (long)local_3c0);
      local_250 = (ulong)bVar1 + local_250;
      local_258 = (int)((uint)bVar1 * (uint)bVar1) + local_258;
    }
    local_248 = (undefined8 *)((long)local_248 + (long)local_234);
  }
  return local_258 - (ulong)(local_250 * local_250) / (ulong)(long)(local_238 * local_23c);
}

Assistant:

uint64_t aom_var_2d_u8_sse2(uint8_t *src, int src_stride, int width,
                            int height) {
  uint8_t *srcp;
  uint64_t s = 0, ss = 0;
  __m128i vzero = _mm_setzero_si128();
  __m128i v_acc_sum = vzero;
  __m128i v_acc_sqs = vzero;
  int i, j;

  // Process 16 elements in a row
  for (i = 0; i < width - 15; i += 16) {
    srcp = src + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 7; j += 8) {
      __m128i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm_loadu_si128((__m128i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m128i vsrc0 = _mm_unpacklo_epi8(vsrc[k], vzero);
        __m128i vsrc1 = _mm_unpackhi_epi8(vsrc[k], vzero);
        v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc0);
        v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc1);

        __m128i vsqs0 = _mm_madd_epi16(vsrc0, vsrc0);
        __m128i vsqs1 = _mm_madd_epi16(vsrc1, vsrc1);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs1);
      }

      // Update total sum and clear the vectors
      s += mm_accumulate_epi16(v_acc_sum);
      ss += mm_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m128i vsrc = _mm_loadu_si128((__m128i *)srcp);
      __m128i vsrc0 = _mm_unpacklo_epi8(vsrc, vzero);
      __m128i vsrc1 = _mm_unpackhi_epi8(vsrc, vzero);
      v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc0);
      v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc1);

      __m128i vsqs0 = _mm_madd_epi16(vsrc0, vsrc0);
      __m128i vsqs1 = _mm_madd_epi16(vsrc1, vsrc1);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs1);

      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm_accumulate_epi16(v_acc_sum);
    ss += mm_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = src;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint8_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}